

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

void __thiscall Block::move(Block *this,int direction)

{
  bool bVar1;
  int direction_local;
  Block *this_local;
  
  bVar1 = isHorizontal(this);
  if (bVar1) {
    if (direction == 0) {
      if (this->column == 0) {
        throwError("Block cannot move LEFT.",this->id);
      }
      this->column = this->column + -1;
    }
    else if (direction == 1) {
      if (this->column + this->length == 6) {
        throwError("Block cannot move RIGHT.",this->id);
      }
      this->column = this->column + 1;
    }
  }
  else if (direction == 2) {
    if (this->row - this->length == -1) {
      throwError("Block cannot move up.",this->id);
    }
    this->row = this->row + -1;
  }
  else if (direction == 3) {
    if (this->row == 5) {
      throwError("Block cannot move down.",this->id);
    }
    this->row = this->row + 1;
  }
  return;
}

Assistant:

void Block::move(int direction) {
    if (this->isHorizontal()) {
        switch (direction) {
            case LEFT:
                if (this->column == 0) {
                    throwError("Block cannot move LEFT.", this->id);
                }

                this->column--;
                break;
            case RIGHT:
                if (this->column + this->length == BOARD_SIZE) {
                    throwError("Block cannot move RIGHT.", this->id);
                }

                this->column++;
                break;
            default:
                break;
        }
    } else {
        switch (direction) {
            case UP:
                if (this->row - this->length + 1 == 0) {
                    throwError("Block cannot move up.", this->id);
                }

                this->row--;
                break;
            case DOWN:
                if (this->row == BOARD_SIZE - 1) {
                    throwError("Block cannot move down.", this->id);
                }

                this->row++;
                break;
            default:
                break;
        }
    }
}